

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_214010::CAPIExternalCommand::configureAttributeNoContext
          (CAPIExternalCommand *this,StringRef name,StringRef value)

{
  int iVar1;
  long *S;
  size_t sVar2;
  SmallVectorImpl<std::__cxx11::string> *this_00;
  int *__s1;
  size_t sVar3;
  StringRef value_local;
  StringRef local_1060;
  string local_1050;
  SmallString<4096U> wd;
  
  sVar3 = value.Length;
  S = (long *)value.Data;
  sVar2 = name.Length;
  __s1 = (int *)name.Data;
  value_local.Data = (char *)S;
  value_local.Length = sVar3;
  if (sVar2 == 0x1d) {
    iVar1 = bcmp(__s1,"repair-via-ownership-analysis",0x1d);
    if (iVar1 == 0) {
      if (sVar3 != 5) {
        if (sVar3 != 4) {
          return false;
        }
        if ((int)*S == 0x65757274) {
          (this->super_ExternalCommand).super_Command.repairViaOwnershipAnalysis = true;
          return true;
        }
        return false;
      }
      iVar1 = bcmp(S,"false",5);
      if (iVar1 == 0) {
        (this->super_ExternalCommand).super_Command.repairViaOwnershipAnalysis = false;
        return true;
      }
    }
    return false;
  }
  if (sVar2 == 7) {
    iVar1 = bcmp(__s1,"outputs",7);
    if (iVar1 != 0) {
      return false;
    }
    this_00 = (SmallVectorImpl<std::__cxx11::string> *)&this->outputNodeNames;
  }
  else {
    if (sVar2 == 10) {
      iVar1 = bcmp(__s1,"deps-style",10);
      if (iVar1 != 0) {
        return false;
      }
      if (sVar3 == 0x24) {
        iVar1 = bcmp(S,"makefile-ignoring-subsequent-outputs",0x24);
        if (iVar1 != 0) {
          return false;
        }
        this->depsFormat =
             llb_buildsystem_dependency_data_format_makefile_ignoring_subsequent_outputs;
        return true;
      }
      if (sVar3 == 8) {
        if (*S != 0x656c6966656b616d) {
          return false;
        }
        this->depsFormat = llb_buildsystem_dependency_data_format_makefile;
        return true;
      }
      if (sVar3 != 0xf) {
        if (sVar3 != 6) {
          return false;
        }
        iVar1 = bcmp(S,"unused",6);
        if (iVar1 != 0) {
          return false;
        }
        this->depsFormat = llb_buildsystem_dependency_data_format_unused;
        return true;
      }
      iVar1 = bcmp(S,"dependency-info",0xf);
      if (iVar1 != 0) {
        return false;
      }
      this->depsFormat = llb_buildsystem_dependency_data_format_dependencyinfo;
      return true;
    }
    if (sVar2 == 0x11) {
      iVar1 = bcmp(__s1,"working-directory",0x11);
      if (iVar1 != 0) {
        return false;
      }
      llvm::SmallVector<char,4096u>::SmallVector<char_const*,void>
                (&wd.super_SmallVector<char,_4096U>,(char *)S,(char *)(sVar3 + (long)S));
      llvm::sys::fs::make_absolute(&wd.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>);
      local_1060.Length =
           (size_t)wd.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                   super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      local_1060.Data =
           (char *)wd.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                   super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      llvm::StringRef::str_abi_cxx11_(&local_1050,&local_1060);
      std::__cxx11::string::operator=((string *)&this->workingDirectory,(string *)&local_1050);
      std::__cxx11::string::_M_dispose();
      llvm::SmallVectorImpl<char>::~SmallVectorImpl
                (&wd.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>);
      return true;
    }
    if (sVar2 != 4) {
      return false;
    }
    if (*__s1 != 0x73706564) {
      return false;
    }
    this_00 = (SmallVectorImpl<std::__cxx11::string> *)&this->depsPaths;
  }
  llvm::
  SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::clear((SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)this_00);
  llvm::SmallVectorImpl<std::__cxx11::string>::emplace_back<llvm::StringRef&>(this_00,&value_local);
  return true;
}

Assistant:

bool configureAttributeNoContext(StringRef name, StringRef value) {
    if (name == "deps") {
      depsPaths.clear();
      depsPaths.emplace_back(value);
    } else if (name == "deps-style") {
      if (value == "unused") {
        depsFormat = llb_buildsystem_dependency_data_format_unused;
      } else if (value == "makefile") {
        depsFormat = llb_buildsystem_dependency_data_format_makefile;
      } else if (value == "dependency-info") {
        depsFormat = llb_buildsystem_dependency_data_format_dependencyinfo;
      } else if (value == "makefile-ignoring-subsequent-outputs") {
        depsFormat = llb_buildsystem_dependency_data_format_makefile_ignoring_subsequent_outputs;
      } else {
        return false;
      }
    } else if (name == "repair-via-ownership-analysis") {
      if (value == "true") {
        repairViaOwnershipAnalysis = true;
        return true;
      } else if (value == "false") {
        repairViaOwnershipAnalysis = false;
        return true;
      } else {
        return false;
      }
    } else if (name == "working-directory") {
      // Ensure the working directory is absolute. This will make sure any
      // relative directories are interpreted as relative to the CWD at the time
      // the rule is defined.
      SmallString<PATH_MAX> wd = value;
      llvm::sys::fs::make_absolute(wd);
      workingDirectory = StringRef(wd);
    } else if (name == "outputs") {
      outputNodeNames.clear();
      outputNodeNames.emplace_back(value);
    } else {
      return false;
    }
    return true;
  }